

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-reduce.cpp
# Opt level: O2

bool __thiscall
Reducer::tryToEmptyFunctions(Reducer *this,vector<wasm::Name,_std::allocator<wasm::Name>_> *names)

{
  pointer pNVar1;
  Builder *this_00;
  Expression *pEVar2;
  bool bVar3;
  long lVar4;
  Nop *pNVar5;
  ostream *poVar6;
  long lVar7;
  long extraout_RDX;
  vector<wasm::Name,_std::allocator<wasm::Name>_> *__range1;
  size_t i;
  ulong uVar8;
  pointer pNVar9;
  Name NVar10;
  Name NVar11;
  undefined1 auStack_58 [8];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> oldBodies;
  Expression *oldBody;
  
  auStack_58 = (undefined1  [8])0x0;
  oldBodies.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  oldBodies.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pNVar9 = (names->super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pNVar1 = (names->super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  oldBody = (Expression *)0x0;
  for (; pNVar9 != pNVar1; pNVar9 = pNVar9 + 1) {
    NVar10.super_IString.str._M_str = (char *)(pNVar9->super_IString).str._M_len;
    NVar10.super_IString.str._M_len =
         (size_t)(this->module)._M_t.
                 super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
                 super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl;
    lVar4 = wasm::Module::getFunction(NVar10);
    oldBodies.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = *(pointer *)(lVar4 + 0x60);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)auStack_58,
               (value_type *)
               &oldBodies.
                super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    if ((*(long *)(lVar4 + 0x20) == 0) &&
       (((ulong)*oldBodies.
                 super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage & 0xfe) != 0x16)) {
      wasm::HeapType::getSignature();
      this_00 = (this->builder)._M_t.
                super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
                super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
                super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
      if (extraout_RDX == 0) {
        pNVar5 = wasm::Builder::makeNop(this_00);
      }
      else {
        pNVar5 = (Nop *)wasm::Builder::makeUnreachable(this_00);
      }
      oldBody = (Expression *)&oldBody->field_0x1;
      *(Nop **)(lVar4 + 0x60) = pNVar5;
    }
  }
  if (oldBody != (Expression *)0x0) {
    bVar3 = writeAndTestReduction(this);
    if (bVar3) {
      poVar6 = std::operator<<((ostream *)&std::cerr,"|        emptied ");
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      poVar6 = std::operator<<(poVar6," / ");
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      bVar3 = true;
      std::operator<<(poVar6," functions\n");
      goto LAB_00130d5f;
    }
  }
  lVar4 = 8;
  for (uVar8 = 0;
      pNVar9 = (names->super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>)._M_impl.
               super__Vector_impl_data._M_start,
      uVar8 < (ulong)((long)(names->super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>).
                            _M_impl.super__Vector_impl_data._M_finish - (long)pNVar9 >> 4);
      uVar8 = uVar8 + 1) {
    pEVar2 = *(pointer)((long)auStack_58 + uVar8 * 8);
    NVar11.super_IString.str._M_str = *(char **)((long)pNVar9 + lVar4 + -8);
    NVar11.super_IString.str._M_len =
         (size_t)(this->module)._M_t.
                 super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
                 super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl;
    lVar7 = wasm::Module::getFunction(NVar11);
    *(Expression **)(lVar7 + 0x60) = pEVar2;
    lVar4 = lVar4 + 0x10;
  }
  bVar3 = false;
LAB_00130d5f:
  std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~_Vector_base
            ((_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)auStack_58);
  return bVar3;
}

Assistant:

bool tryToEmptyFunctions(std::vector<Name> names) {
    std::vector<Expression*> oldBodies;
    size_t actuallyEmptied = 0;
    for (auto name : names) {
      auto* func = module->getFunction(name);
      auto* oldBody = func->body;
      oldBodies.push_back(oldBody);
      // Nothing to do for imported functions (body is nullptr) or for bodies
      // that have already been as reduced as we can make them.
      if (func->imported() || oldBody->is<Unreachable>() ||
          oldBody->is<Nop>()) {
        continue;
      }
      actuallyEmptied++;
      bool useUnreachable = func->getResults() != Type::none;
      if (useUnreachable) {
        func->body = builder->makeUnreachable();
      } else {
        func->body = builder->makeNop();
      }
    }
    if (actuallyEmptied > 0 && writeAndTestReduction()) {
      std::cerr << "|        emptied " << actuallyEmptied << " / "
                << names.size() << " functions\n";
      return true;
    } else {
      // Restore the bodies.
      for (size_t i = 0; i < names.size(); i++) {
        module->getFunction(names[i])->body = oldBodies[i];
      }
      return false;
    }
  }